

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint16_t *histogram_symbols)

{
  ulong uVar1;
  HistogramPair *pHVar2;
  ushort uVar3;
  VP8LHistogram *pVVar4;
  VP8LHistogram *pVVar5;
  uint32_t *__dest;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  undefined8 uVar12;
  uint16_t uVar13;
  int tmp;
  int iVar14;
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  VP8LHistogramSet *set;
  uint16_t *__s;
  long lVar19;
  ulong uVar20;
  void *__base;
  void *__dest_00;
  byte bVar21;
  long lVar22;
  int iVar23;
  ushort *puVar24;
  uint16_t uVar25;
  ushort uVar26;
  HistogramPair *pHVar27;
  short sVar28;
  short sVar29;
  int iVar30;
  VP8LHistogram **ppVVar31;
  int iVar32;
  HistogramPair *pHVar33;
  VP8LHistogram **ppVVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  VP8LHistogramSet *pVVar39;
  ulong uVar40;
  float fVar41;
  PixOrCopy *pPVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  ulong extraout_XMM0_Qb;
  double range_1;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  double range;
  double dVar53;
  undefined1 auVar54 [16];
  double dVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar75;
  undefined1 auVar73 [16];
  int iVar76;
  undefined1 auVar74 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar79 [16];
  double dVar80;
  anon_struct_4_2_be341b0f bin_info [64];
  VP8LHistogram *local_1c0;
  ulong local_1b8;
  uint local_19c;
  HistoQueue local_198;
  undefined1 local_188 [16];
  ulong local_178;
  VP8LHistogramSet *local_170;
  HistogramPair *local_168;
  ulong local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  VP8LRefsCursor local_138 [11];
  
  bVar21 = (byte)histogram_bits;
  if (histogram_bits == 0) {
    uVar20 = 1;
  }
  else {
    iVar23 = 1 << (bVar21 & 0x1f);
    uVar20 = (ulong)(((ysize + iVar23) - 1U >> (bVar21 & 0x1f)) *
                    ((xsize + iVar23) - 1U >> (bVar21 & 0x1f)));
  }
  iVar23 = (int)uVar20;
  set = VP8LAllocateHistogramSet(iVar23,cache_bits);
  uVar36 = 0x40;
  if (low_effort != 0) {
    uVar36 = 4;
  }
  __s = (uint16_t *)WebPSafeMalloc((ulong)(uint)(iVar23 * 2),8);
  pVVar39 = set;
  if (__s == (uint16_t *)0x0 || set == (VP8LHistogramSet *)0x0) {
LAB_001417e3:
    iVar23 = 0;
    goto LAB_00142d20;
  }
  local_188._0_4_ = ((1 << (bVar21 & 0x1f)) + xsize) - 1U >> (bVar21 & 0x1f);
  ppVVar31 = set->histograms;
  local_178 = uVar36;
  VP8LRefsCursorInit(local_138,refs);
  local_170 = set;
  VP8LHistogramSetClear(set);
  if (local_138[0].cur_pos != (PixOrCopy *)0x0) {
    iVar32 = 0;
    pVVar39 = (VP8LHistogramSet *)0x0;
    do {
      set = pVVar39;
      pPVar42 = local_138[0].cur_pos;
      VP8LHistogramAddSinglePixOrCopy
                (ppVVar31[((int)set >> (bVar21 & 0x1f)) +
                          (iVar32 >> (bVar21 & 0x1f)) * local_188._0_4_],local_138[0].cur_pos,
                 (_func_int_int_int *)0x0,0);
      for (uVar35 = (uint)pPVar42->len + (int)set; xsize <= (int)uVar35; uVar35 = uVar35 - xsize) {
        iVar32 = iVar32 + 1;
      }
      local_138[0].cur_pos = local_138[0].cur_pos + 1;
      if (local_138[0].cur_pos == local_138[0].last_pos_) {
        VP8LRefsCursorNextBlock(local_138);
      }
      pVVar39 = (VP8LHistogramSet *)(ulong)uVar35;
    } while (local_138[0].cur_pos != (PixOrCopy *)0x0);
  }
  pVVar39 = local_170;
  local_1b8 = uVar20;
  if (0 < local_170->max_size) {
    local_188._0_8_ = local_170->histograms;
    ppVVar31 = image_histo->histograms;
    uVar36 = 0;
    uVar25 = 0;
    do {
      pVVar4 = *(VP8LHistogram **)(local_188._0_8_ + uVar36 * 8);
      UpdateHistogramCost(pVVar4);
      if ((((pVVar4->is_used_[0] == '\0') && (pVVar4->is_used_[1] == '\0')) &&
          (pVVar4->is_used_[2] == '\0')) &&
         ((pVVar4->is_used_[3] == '\0' && (pVVar4->is_used_[4] == '\0')))) {
        image_histo->histograms[(int)uVar36] = (VP8LHistogram *)0x0;
        uVar35 = image_histo->size;
        if (0 < (int)uVar35 && uVar35 - 1 == (int)uVar36) {
          do {
            if (image_histo->histograms[(ulong)uVar35 - 1] != (VP8LHistogram *)0x0) break;
            image_histo->size = uVar35 - 1;
            bVar6 = 1 < (int)uVar35;
            uVar35 = uVar35 - 1;
          } while (bVar6);
        }
        local_1b8 = (ulong)((int)local_1b8 - 1);
        pVVar39->histograms[uVar36] = (VP8LHistogram *)0x0;
        uVar35 = pVVar39->size;
        uVar13 = 0xffff;
        if (0 < (int)uVar35 && uVar36 == uVar35 - 1) {
          do {
            if (pVVar39->histograms[(ulong)uVar35 - 1] != (VP8LHistogram *)0x0) break;
            pVVar39->size = uVar35 - 1;
            bVar6 = 1 < (int)uVar35;
            uVar35 = uVar35 - 1;
          } while (bVar6);
        }
      }
      else {
        pVVar5 = ppVVar31[uVar36];
        iVar32 = pVVar5->palette_code_bits_;
        iVar14 = (4 << ((byte)iVar32 & 0x1f)) + 0x1138;
        uVar35 = (1 << ((byte)iVar32 & 0x1f)) + 0x118;
        if (iVar32 < 1) {
          uVar35 = 0x118;
        }
        set = (VP8LHistogramSet *)(ulong)uVar35;
        __dest = pVVar5->literal_;
        if (iVar32 < 1) {
          iVar14 = 0x1138;
        }
        memcpy(pVVar5,pVVar4,(long)iVar14);
        pVVar39 = local_170;
        pVVar5->literal_ = __dest;
        memcpy(__dest,pVVar4->literal_,(long)(int)uVar35 << 2);
        uVar13 = uVar25;
        uVar25 = uVar25 + 1;
      }
      histogram_symbols[uVar36] = uVar13;
      uVar36 = uVar36 + 1;
    } while ((long)uVar36 < (long)pVVar39->max_size);
  }
  if ((quality < 100) && (iVar32 = (int)local_1b8, (int)local_178 * 2 < iVar32)) {
    if (quality < 0x5a) {
      dVar80 = *(double *)(&DAT_0014fb40 + (ulong)(0x100 < iVar23) * 8);
      if (0x200 < iVar23) {
        dVar80 = dVar80 * 0.5;
      }
      if (0x400 < iVar23) {
        dVar80 = dVar80 * 0.5;
      }
      if (quality < 0x33) {
        dVar80 = dVar80 * 0.5;
      }
    }
    else {
      dVar80 = 0.16;
    }
    iVar23 = image_histo->size;
    lVar19 = (long)iVar23;
    ppVVar31 = image_histo->histograms;
    if (0 < lVar19) {
      auVar58 = ZEXT816(0);
      auVar59 = ZEXT816(0x47d2ced32a16a1b1);
      lVar22 = 0;
      dVar51 = 1e+38;
      auVar43 = ZEXT816(0x47d2ced32a16a1b1);
      dVar46 = 0.0;
      do {
        pVVar4 = ppVVar31[lVar22];
        dVar53 = dVar46;
        if (pVVar4 != (VP8LHistogram *)0x0) {
          dVar55 = pVVar4->literal_cost_;
          uVar56 = SUB84(dVar55,0);
          uVar57 = (undefined4)((ulong)dVar55 >> 0x20);
          dVar53 = dVar55;
          if (dVar55 <= dVar46) {
            dVar53 = dVar46;
          }
          if (auVar59._0_8_ <= dVar55) {
            uVar56 = auVar59._0_4_;
            uVar57 = auVar59._4_4_;
          }
          auVar77._0_8_ = pVVar4->red_cost_;
          auVar77._8_8_ = pVVar4->blue_cost_;
          dVar46 = (double)auVar77._0_8_;
          if (dVar51 <= (double)auVar77._0_8_) {
            dVar46 = dVar51;
          }
          auVar58 = maxpd(auVar77,auVar58);
          if ((double)auVar77._8_8_ < auVar43._0_8_) {
            auVar43._8_8_ = auVar77._8_8_;
            auVar43._0_8_ = auVar77._8_8_;
          }
          auVar59._4_4_ = uVar57;
          auVar59._0_4_ = uVar56;
          auVar59._8_8_ = 0;
          dVar51 = dVar46;
        }
        lVar22 = lVar22 + 1;
        dVar46 = dVar53;
      } while (lVar19 != lVar22);
      dVar53 = dVar53 - auVar59._0_8_;
      dVar55 = auVar58._0_8_ - dVar51;
      dVar46 = auVar58._8_8_ - auVar43._0_8_;
      lVar22 = 0;
      do {
        pVVar4 = ppVVar31[lVar22];
        if (pVVar4 != (VP8LHistogram *)0x0) {
          uVar25 = (uint16_t)(int)(((pVVar4->literal_cost_ - auVar59._0_8_) * 3.999999) / dVar53);
          if (dVar53 <= 0.0) {
            uVar25 = 0;
          }
          if (low_effort == 0) {
            sVar29 = (short)((int)(((pVVar4->red_cost_ - dVar51) * 3.999999) / dVar55) << 2);
            if (dVar55 <= 0.0) {
              sVar29 = 0;
            }
            sVar28 = (short)(int)(((pVVar4->blue_cost_ - auVar43._0_8_) * 3.999999) / dVar46);
            if (dVar46 <= 0.0) {
              sVar28 = 0;
            }
            uVar25 = uVar25 * 0x10 + sVar28 + sVar29;
          }
          __s[lVar22] = uVar25;
        }
        lVar22 = lVar22 + 1;
      } while (lVar19 != lVar22);
    }
    auVar43 = _DAT_00148240;
    local_1c0 = tmp_histo;
    set = (VP8LHistogramSet *)(__s + uVar20);
    uVar36 = 0;
    do {
      *(undefined4 *)((long)&local_138[0].cur_pos + uVar36 * 4) = 0xffff;
      uVar36 = uVar36 + 1;
    } while ((local_178 & 0xffffffff) != uVar36);
    local_160 = local_1b8;
    if (0 < iVar32) {
      lVar19 = local_1b8 - 1;
      auVar44._8_4_ = (int)lVar19;
      auVar44._0_8_ = lVar19;
      auVar44._12_4_ = (int)((ulong)lVar19 >> 0x20);
      uVar36 = 0;
      auVar44 = auVar44 ^ _DAT_00148240;
      auVar58 = _DAT_0014bc70;
      auVar48 = _DAT_0014bc80;
      auVar52 = _DAT_00149740;
      auVar54 = _DAT_00149560;
      do {
        auVar59 = auVar54 ^ auVar43;
        iVar14 = auVar44._0_4_;
        iVar72 = -(uint)(iVar14 < auVar59._0_4_);
        iVar30 = auVar44._4_4_;
        auVar60._4_4_ = -(uint)(iVar30 < auVar59._4_4_);
        iVar76 = auVar44._8_4_;
        iVar75 = -(uint)(iVar76 < auVar59._8_4_);
        iVar45 = auVar44._12_4_;
        auVar60._12_4_ = -(uint)(iVar45 < auVar59._12_4_);
        auVar68._4_4_ = iVar72;
        auVar68._0_4_ = iVar72;
        auVar68._8_4_ = iVar75;
        auVar68._12_4_ = iVar75;
        auVar77 = pshuflw(in_XMM11,auVar68,0xe8);
        auVar62._4_4_ = -(uint)(auVar59._4_4_ == iVar30);
        auVar62._12_4_ = -(uint)(auVar59._12_4_ == iVar45);
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar79 = pshuflw(in_XMM12,auVar62,0xe8);
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar59 = pshuflw(auVar77,auVar60,0xe8);
        auVar78._8_4_ = 0xffffffff;
        auVar78._0_8_ = 0xffffffffffffffff;
        auVar78._12_4_ = 0xffffffff;
        auVar78 = (auVar59 | auVar79 & auVar77) ^ auVar78;
        auVar59 = packssdw(auVar78,auVar78);
        uVar25 = (uint16_t)uVar36;
        if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __s[uVar20 + uVar36] = uVar25;
        }
        auVar60 = auVar62 & auVar68 | auVar60;
        auVar59 = packssdw(auVar60,auVar60);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar7,auVar59 ^ auVar7);
        if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
          __s[uVar20 + uVar36 + 1] = uVar25 + 1;
        }
        auVar59 = auVar52 ^ auVar43;
        iVar72 = -(uint)(iVar14 < auVar59._0_4_);
        auVar73._4_4_ = -(uint)(iVar30 < auVar59._4_4_);
        iVar75 = -(uint)(iVar76 < auVar59._8_4_);
        auVar73._12_4_ = -(uint)(iVar45 < auVar59._12_4_);
        auVar61._4_4_ = iVar72;
        auVar61._0_4_ = iVar72;
        auVar61._8_4_ = iVar75;
        auVar61._12_4_ = iVar75;
        auVar69._4_4_ = -(uint)(auVar59._4_4_ == iVar30);
        auVar69._12_4_ = -(uint)(auVar59._12_4_ == iVar45);
        auVar69._0_4_ = auVar69._4_4_;
        auVar69._8_4_ = auVar69._12_4_;
        auVar73._0_4_ = auVar73._4_4_;
        auVar73._8_4_ = auVar73._12_4_;
        auVar59 = auVar69 & auVar61 | auVar73;
        auVar59 = packssdw(auVar59,auVar59);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar8,auVar59 ^ auVar8);
        if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          __s[uVar20 + uVar36 + 2] = uVar25 + 2;
        }
        auVar78 = pshufhw(auVar61,auVar61,0x84);
        auVar60 = pshufhw(auVar69,auVar69,0x84);
        auVar62 = pshufhw(auVar78,auVar73,0x84);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar63 = (auVar62 | auVar60 & auVar78) ^ auVar63;
        auVar78 = packssdw(auVar63,auVar63);
        if ((auVar78 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          __s[uVar20 + uVar36 + 3] = uVar25 + 3;
        }
        auVar78 = auVar48 ^ auVar43;
        iVar72 = -(uint)(iVar14 < auVar78._0_4_);
        auVar65._4_4_ = -(uint)(iVar30 < auVar78._4_4_);
        iVar75 = -(uint)(iVar76 < auVar78._8_4_);
        auVar65._12_4_ = -(uint)(iVar45 < auVar78._12_4_);
        auVar70._4_4_ = iVar72;
        auVar70._0_4_ = iVar72;
        auVar70._8_4_ = iVar75;
        auVar70._12_4_ = iVar75;
        auVar59 = pshuflw(auVar59,auVar70,0xe8);
        auVar64._4_4_ = -(uint)(auVar78._4_4_ == iVar30);
        auVar64._12_4_ = -(uint)(auVar78._12_4_ == iVar45);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        in_XMM12 = pshuflw(auVar79 & auVar77,auVar64,0xe8);
        in_XMM12 = in_XMM12 & auVar59;
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar59 = pshuflw(auVar59,auVar65,0xe8);
        auVar79._8_4_ = 0xffffffff;
        auVar79._0_8_ = 0xffffffffffffffff;
        auVar79._12_4_ = 0xffffffff;
        auVar79 = (auVar59 | in_XMM12) ^ auVar79;
        auVar59 = packssdw(auVar79,auVar79);
        if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __s[uVar20 + uVar36 + 4] = uVar25 + 4;
        }
        auVar65 = auVar64 & auVar70 | auVar65;
        auVar59 = packssdw(auVar65,auVar65);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar9,auVar59 ^ auVar9);
        if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          __s[uVar20 + uVar36 + 5] = uVar25 + 5;
        }
        auVar59 = auVar58 ^ auVar43;
        iVar14 = -(uint)(iVar14 < auVar59._0_4_);
        auVar74._4_4_ = -(uint)(iVar30 < auVar59._4_4_);
        iVar76 = -(uint)(iVar76 < auVar59._8_4_);
        auVar74._12_4_ = -(uint)(iVar45 < auVar59._12_4_);
        auVar66._4_4_ = iVar14;
        auVar66._0_4_ = iVar14;
        auVar66._8_4_ = iVar76;
        auVar66._12_4_ = iVar76;
        auVar71._4_4_ = -(uint)(auVar59._4_4_ == iVar30);
        auVar71._12_4_ = -(uint)(auVar59._12_4_ == iVar45);
        auVar71._0_4_ = auVar71._4_4_;
        auVar71._8_4_ = auVar71._12_4_;
        auVar74._0_4_ = auVar74._4_4_;
        auVar74._8_4_ = auVar74._12_4_;
        auVar59 = auVar71 & auVar66 | auVar74;
        auVar59 = packssdw(auVar59,auVar59);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar59 ^ auVar10,auVar59 ^ auVar10);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          __s[uVar20 + uVar36 + 6] = uVar25 + 6;
        }
        auVar59 = pshufhw(auVar66,auVar66,0x84);
        auVar78 = pshufhw(auVar71,auVar71,0x84);
        auVar77 = pshufhw(auVar59,auVar74,0x84);
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar67 = (auVar77 | auVar78 & auVar59) ^ auVar67;
        auVar59 = packssdw(auVar67,auVar67);
        if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          __s[uVar20 + uVar36 + 7] = uVar25 + 7;
        }
        uVar36 = uVar36 + 8;
        lVar19 = auVar54._8_8_;
        auVar54._0_8_ = auVar54._0_8_ + 8;
        auVar54._8_8_ = lVar19 + 8;
        lVar19 = auVar52._8_8_;
        auVar52._0_8_ = auVar52._0_8_ + 8;
        auVar52._8_8_ = lVar19 + 8;
        lVar19 = auVar48._8_8_;
        auVar48._0_8_ = auVar48._0_8_ + 8;
        auVar48._8_8_ = lVar19 + 8;
        lVar19 = auVar58._8_8_;
        auVar58._0_8_ = auVar58._0_8_ + 8;
        auVar58._8_8_ = lVar19 + 8;
      } while ((iVar32 + 7U & 0xfffffff8) != uVar36);
    }
    if (0 < iVar23) {
      lVar19 = 0;
      local_178 = CONCAT44(local_178._4_4_,iVar32);
      local_188._0_8_ = ppVVar31;
      do {
        pVVar4 = ppVVar31[lVar19];
        if (pVVar4 != (VP8LHistogram *)0x0) {
          uVar20 = (ulong)__s[lVar19];
          pHVar33 = (HistogramPair *)(long)*(short *)((long)&local_138[0].cur_pos + uVar20 * 4);
          if (pHVar33 == (HistogramPair *)0xffffffffffffffff) {
            *(short *)((long)&local_138[0].cur_pos + uVar20 * 4) = (short)lVar19;
          }
          else {
            iVar23 = (int)lVar19;
            if (low_effort == 0) {
              local_158 = -pVVar4->bit_cost_ * dVar80;
              pVVar5 = ppVVar31[(long)pHVar33];
              local_198.queue = (HistogramPair *)0x0;
              local_148 = pVVar4->bit_cost_ + pVVar5->bit_cost_;
              uStack_150 = 0x8000000000000000;
              uStack_140 = 0;
              local_168 = pHVar33;
              iVar14 = GetCombinedHistogramEntropy
                                 (pVVar5,pVVar4,local_158 + local_148,(double *)&local_198);
              if (iVar14 != 0) {
                VP8LHistogramAdd(pVVar5,pVVar4,local_1c0);
                uVar15 = pVVar5->trivial_symbol_;
                if (uVar15 != pVVar4->trivial_symbol_) {
                  uVar15 = 0xffffffff;
                }
                local_1c0->trivial_symbol_ = uVar15;
                local_1c0->bit_cost_ = (double)local_198.queue;
                local_1c0->palette_code_bits_ = pVVar5->palette_code_bits_;
              }
              ppVVar31 = (VP8LHistogram **)local_188._0_8_;
              if ((double)local_198.queue - local_148 < local_158) {
                if ((local_1c0->trivial_symbol_ == 0xffffffff) &&
                   ((((*(VP8LHistogram **)(local_188._0_8_ + lVar19 * 8))->trivial_symbol_ !=
                      0xffffffff ||
                     ((*(VP8LHistogram **)(local_188._0_8_ + local_168 * 8))->trivial_symbol_ !=
                      0xffffffff)) &&
                    (uVar3 = *(ushort *)((long)&local_138[0].cur_pos + uVar20 * 4 + 2), uVar3 < 0x20
                    )))) {
                  *(ushort *)((long)&local_138[0].cur_pos + uVar20 * 4 + 2) = uVar3 + 1;
                }
                else {
                  pVVar4 = *(VP8LHistogram **)(local_188._0_8_ + local_168 * 8);
                  *(VP8LHistogram **)(local_188._0_8_ + local_168 * 8) = local_1c0;
                  image_histo->histograms[iVar23] = (VP8LHistogram *)0x0;
                  uVar35 = image_histo->size;
                  if (0 < (int)uVar35 && uVar35 - 1 == iVar23) {
                    do {
                      if (image_histo->histograms[(ulong)uVar35 - 1] != (VP8LHistogram *)0x0) break;
                      image_histo->size = uVar35 - 1;
                      bVar6 = 1 < (int)uVar35;
                      uVar35 = uVar35 - 1;
                    } while (bVar6);
                  }
                  local_178 = CONCAT44(local_178._4_4_,(int)local_178 + -1);
                  *(uint16_t *)((long)&set->size + (ulong)histogram_symbols[lVar19] * 2) =
                       histogram_symbols[(long)local_168];
                  local_1c0 = pVVar4;
                }
              }
            }
            else {
              pVVar5 = ppVVar31[(long)pHVar33];
              VP8LHistogramAdd(pVVar4,pVVar5,pVVar5);
              uVar15 = pVVar4->trivial_symbol_;
              if (uVar15 != pVVar5->trivial_symbol_) {
                uVar15 = 0xffffffff;
              }
              pVVar5->trivial_symbol_ = uVar15;
              image_histo->histograms[iVar23] = (VP8LHistogram *)0x0;
              uVar35 = image_histo->size;
              if (0 < (int)uVar35 && uVar35 - 1 == iVar23) {
                do {
                  if (image_histo->histograms[(ulong)uVar35 - 1] != (VP8LHistogram *)0x0) break;
                  image_histo->size = uVar35 - 1;
                  bVar6 = 1 < (int)uVar35;
                  uVar35 = uVar35 - 1;
                } while (bVar6);
              }
              local_178 = CONCAT44(local_178._4_4_,(int)local_178 + -1);
              *(uint16_t *)((long)&set->size + (ulong)histogram_symbols[lVar19] * 2) =
                   histogram_symbols[(long)pHVar33];
              ppVVar31 = (VP8LHistogram **)local_188._0_8_;
            }
          }
        }
        pVVar39 = local_170;
        local_1b8 = local_178;
        lVar19 = lVar19 + 1;
        uVar20 = (ulong)image_histo->size;
      } while (lVar19 < (long)uVar20);
      if (0 < image_histo->size && low_effort != 0) {
        lVar19 = 0;
        do {
          if (ppVVar31[lVar19] != (VP8LHistogram *)0x0) {
            UpdateHistogramCost(ppVVar31[lVar19]);
            uVar20 = (ulong)(uint)image_histo->size;
            ppVVar31 = (VP8LHistogram **)local_188._0_8_;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (int)uVar20);
      }
    }
    local_1b8 = local_1b8 & 0xffffffff;
    if (0 < iVar32) {
      uVar20 = 0;
      bVar6 = false;
      do {
        do {
          bVar11 = bVar6;
          uVar3 = *(ushort *)((long)&set->size + uVar20 * 2);
          uVar26 = *(ushort *)((long)&set->size + (ulong)uVar3 * 2);
          if (uVar3 != uVar26) {
            puVar24 = (ushort *)((long)&set->size + (ulong)uVar3 * 2);
            do {
              uVar3 = *(ushort *)((long)&set->size + (ulong)uVar26 * 2);
              *puVar24 = uVar3;
              puVar24 = (ushort *)((long)&set->size + (ulong)uVar3 * 2);
              uVar26 = *puVar24;
            } while (uVar3 != uVar26);
            if (uVar3 != *(ushort *)((long)&set->size + uVar20 * 2)) {
              *(ushort *)((long)&set->size + uVar20 * 2) = uVar3;
              bVar11 = true;
            }
          }
          uVar20 = uVar20 + 1;
          bVar6 = bVar11;
        } while (uVar20 != local_160);
        uVar20 = 0;
        bVar6 = false;
      } while (bVar11);
    }
    memset(__s,0,(long)image_histo->max_size * 2);
    iVar23 = image_histo->max_size;
    if (0 < (long)iVar23) {
      lVar19 = 0;
      uVar25 = 0;
      do {
        if ((ulong)histogram_symbols[lVar19] != 0xffff) {
          uVar20 = (ulong)*(ushort *)((long)&set->size + (ulong)histogram_symbols[lVar19] * 2);
          if (uVar20 == 0) {
            uVar13 = *__s;
          }
          else {
            uVar13 = __s[uVar20];
            if (uVar13 == 0) {
              uVar13 = uVar25 + 1;
              __s[uVar20] = uVar13;
              uVar25 = uVar13;
            }
          }
          histogram_symbols[lVar19] = uVar13;
        }
        lVar19 = lVar19 + 1;
      } while (iVar23 != lVar19);
    }
    if (low_effort == 0) goto LAB_00142349;
  }
  else {
LAB_00142349:
    fVar41 = (float)quality / 100.0;
    local_158._0_4_ = (int)(fVar41 * fVar41 * fVar41 * 99.0 + 1.0);
    iVar23 = (int)local_1b8;
    if ((int)local_158 <= iVar23) {
      ppVVar31 = image_histo->histograms;
      __base = WebPSafeMalloc((long)iVar23,4);
      if (__base == (void *)0x0) goto LAB_001417e3;
      local_198.size = 0;
      local_198.max_size = 9;
      pHVar33 = (HistogramPair *)WebPSafeMalloc(10,0x18);
      local_198.queue = pHVar33;
      if (pHVar33 == (HistogramPair *)0x0) {
        pHVar27 = (HistogramPair *)0x0;
      }
      else {
        iVar32 = image_histo->size;
        if (0 < iVar32) {
          lVar19 = 0;
          iVar14 = 0;
          do {
            if (ppVVar31[lVar19] != (VP8LHistogram *)0x0) {
              lVar22 = (long)iVar14;
              iVar14 = iVar14 + 1;
              *(int *)((long)__base + lVar22 * 4) = (int)lVar19;
              iVar32 = image_histo->size;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar32);
        }
        if (0 < iVar23) {
          local_148 = (double)CONCAT44(local_148._4_4_,(int)(local_1b8 >> 0x1f) + iVar23 >> 1);
          uVar36 = 1;
          uVar20 = 0;
          iVar32 = 0;
          iVar30 = 0;
          iVar14 = 0;
          local_178 = CONCAT44(local_178._4_4_,iVar23);
          local_168 = pHVar33;
          do {
            iVar23 = (int)local_1b8;
            pHVar33 = local_168;
            if (iVar23 < (int)local_158) break;
            iVar14 = iVar14 + 1;
            if (local_148._0_4_ <= iVar14) break;
            if (iVar32 == 0) {
              dVar80 = 0.0;
            }
            else {
              dVar80 = (local_198.queue)->cost_diff;
            }
            auVar50._8_8_ = 0;
            auVar50._0_8_ = dVar80;
            local_19c = 1;
            uVar35 = iVar23 - 1;
            if (1 < iVar23) {
              uVar37 = local_1b8 >> 1;
              do {
                uVar38 = (uint)((uVar36 * 0xbc8f) / 0x7fffffff);
                uVar36 = (ulong)((int)(uVar36 * 0xbc8f) + (uVar38 << 0x1f | uVar38));
                uVar1 = uVar36 % (ulong)(uVar35 * iVar23);
                uVar20 = uVar1 / uVar35;
                uVar38 = (uint)(uVar1 % (ulong)uVar35);
                local_188 = auVar50;
                dVar80 = HistoQueuePush(&local_198,ppVVar31,*(int *)((long)__base + uVar20 * 4),
                                        *(int *)((long)__base +
                                                (ulong)((uVar38 + 1) - (uint)(uVar38 < (uint)uVar20)
                                                       ) * 4),auVar50._0_8_);
                uVar20 = local_198._8_8_ & 0xffffffff;
                iVar32 = local_198.size;
                if ((dVar80 < 0.0) && (local_198.size == local_198.max_size)) break;
                auVar49._0_8_ = local_188._0_8_ & -(ulong)(0.0 <= dVar80);
                auVar49._8_8_ = local_188._8_8_ & extraout_XMM0_Qb;
                auVar47._0_8_ = ~-(ulong)(0.0 <= dVar80) & (ulong)dVar80;
                auVar47._8_8_ = 0;
                auVar50 = auVar49 | auVar47;
                uVar38 = (int)uVar37 - 1;
                uVar37 = (ulong)uVar38;
              } while (uVar38 != 0);
            }
            pHVar33 = local_198.queue;
            if (iVar32 == 0) {
              iVar32 = 0;
            }
            else {
              uVar38 = (local_198.queue)->idx1;
              local_19c = (local_198.queue)->idx2;
              __dest_00 = bsearch(&local_19c,__base,(long)iVar23,4,PairComparison);
              memmove(__dest_00,(void *)((long)__dest_00 + 4),
                      (((ulong)~((long)__dest_00 - (long)__base) >> 2) + (long)iVar23) * 4);
              local_188._0_8_ = ppVVar31[(int)local_19c];
              pVVar4 = ppVVar31[(int)uVar38];
              VP8LHistogramAdd(ppVVar31[(int)local_19c],pVVar4,pVVar4);
              uVar15 = *(uint32_t *)(local_188._0_8_ + 0xcac);
              if (uVar15 != pVVar4->trivial_symbol_) {
                uVar15 = 0xffffffff;
              }
              pVVar4->trivial_symbol_ = uVar15;
              ppVVar31[(int)uVar38]->bit_cost_ = pHVar33->cost_combo;
              image_histo->histograms[(int)local_19c] = (VP8LHistogram *)0x0;
              uVar16 = image_histo->size;
              if (0 < (int)uVar16 && uVar16 - 1 == local_19c) {
                do {
                  if (image_histo->histograms[(ulong)uVar16 - 1] != (VP8LHistogram *)0x0) break;
                  image_histo->size = uVar16 - 1;
                  bVar6 = 1 < (int)uVar16;
                  uVar16 = uVar16 - 1;
                } while (bVar6);
              }
              if (0 < (int)uVar20) {
                iVar23 = 0;
                do {
                  pHVar27 = pHVar33 + iVar23;
                  uVar16 = pHVar27->idx1;
                  uVar17 = pHVar27->idx2;
                  if ((uVar16 != local_19c && uVar16 != uVar38) ||
                     (uVar17 != local_19c && uVar17 != uVar38)) {
                    if (uVar16 != local_19c && uVar16 != uVar38) {
                      bVar6 = true;
                      if (uVar17 == local_19c || uVar17 == uVar38) {
                        pHVar27->idx2 = uVar38;
                        bVar6 = false;
                        uVar17 = uVar38;
                      }
                    }
                    else {
                      pHVar27->idx1 = uVar38;
                      bVar6 = false;
                      uVar16 = uVar38;
                    }
                    uVar18 = uVar16;
                    if ((int)uVar17 < (int)uVar16) {
                      pHVar27->idx2 = uVar16;
                      pHVar27->idx1 = uVar17;
                      uVar18 = uVar17;
                      uVar17 = uVar16;
                    }
                    if (bVar6) {
                      dVar80 = pHVar27->cost_diff;
                    }
                    else {
                      pVVar4 = ppVVar31[(int)uVar18];
                      pVVar5 = ppVVar31[(int)uVar17];
                      dVar80 = pVVar4->bit_cost_ + pVVar5->bit_cost_;
                      pHVar27->cost_combo = 0.0;
                      local_188._0_8_ = uVar20;
                      GetCombinedHistogramEntropy(pVVar4,pVVar5,dVar80 + 0.0,&pHVar27->cost_combo);
                      dVar80 = pHVar27->cost_combo - dVar80;
                      pHVar27->cost_diff = dVar80;
                      uVar20 = local_188._0_8_;
                      if (0.0 <= dVar80) {
                        uVar20 = (ulong)local_188._0_4_;
                        uVar37 = uVar20;
                        goto LAB_001426cd;
                      }
                    }
                    if (dVar80 < pHVar33->cost_diff) {
                      local_138[0].last_pos_ = (PixOrCopy *)pHVar33->cost_combo;
                      local_138[0].cur_pos = *(PixOrCopy **)pHVar33;
                      local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar33->cost_diff;
                      pHVar33->cost_combo = pHVar27->cost_combo;
                      iVar32 = pHVar27->idx2;
                      dVar80 = pHVar27->cost_diff;
                      pHVar33->idx1 = pHVar27->idx1;
                      pHVar33->idx2 = iVar32;
                      pHVar33->cost_diff = dVar80;
                      pHVar27->cost_combo = (double)local_138[0].last_pos_;
                      *(PixOrCopy **)pHVar27 = local_138[0].cur_pos;
                      pHVar27->cost_diff = (double)local_138[0].cur_block_;
                    }
                    iVar23 = iVar23 + 1;
                  }
                  else {
                    uVar37 = (long)(int)uVar20;
LAB_001426cd:
                    pHVar27->cost_combo = pHVar33[uVar37 - 1].cost_combo;
                    pHVar2 = pHVar33 + (uVar37 - 1);
                    iVar32 = pHVar2->idx2;
                    dVar80 = pHVar2->cost_diff;
                    pHVar27->idx1 = pHVar2->idx1;
                    pHVar27->idx2 = iVar32;
                    pHVar27->cost_diff = dVar80;
                    uVar20 = (ulong)((int)uVar20 - 1);
                  }
                } while (iVar23 < (int)uVar20);
              }
              iVar32 = (int)uVar20;
              local_198.size = iVar32;
              iVar14 = 0;
              local_1b8 = (ulong)uVar35;
            }
            iVar23 = (int)local_1b8;
            iVar30 = iVar30 + 1;
            pHVar33 = local_168;
            pVVar39 = local_170;
          } while (iVar30 != (int)local_178);
        }
        set = (VP8LHistogramSet *)(ulong)((int)local_158 < iVar23);
        pHVar27 = local_198.queue;
      }
      WebPSafeFree(pHVar27);
      WebPSafeFree(__base);
      iVar23 = 0;
      if (pHVar33 == (HistogramPair *)0x0) goto LAB_00142d20;
      if (((ulong)set & 1) != 0) goto LAB_00142b2b;
    }
    iVar23 = image_histo->size;
    if ((long)iVar23 < 1) {
      uVar20 = 0;
    }
    else {
      lVar19 = 0;
      uVar36 = 0;
      do {
        pVVar4 = image_histo->histograms[lVar19];
        uVar20 = uVar36;
        if (pVVar4 != (VP8LHistogram *)0x0) {
          uVar20 = (ulong)((int)uVar36 + 1);
          image_histo->histograms[uVar36] = pVVar4;
        }
        lVar19 = lVar19 + 1;
        uVar36 = uVar20;
      } while (iVar23 != lVar19);
    }
    iVar23 = (int)uVar20;
    image_histo->size = iVar23;
    local_188._0_8_ = image_histo->histograms;
    local_198._8_8_ = (ulong)(uint)(iVar23 * iVar23) << 0x20;
    local_198.queue = (HistogramPair *)WebPSafeMalloc((ulong)(iVar23 * iVar23 + 1),0x18);
    if (local_198.queue == (HistogramPair *)0x0) {
      iVar23 = 0;
      WebPSafeFree((void *)0x0);
      goto LAB_00142d20;
    }
    if (0 < iVar23) {
      uVar37 = 1;
      uVar36 = 0;
      do {
        uVar1 = uVar36 + 1;
        uVar40 = uVar37;
        if (uVar1 < uVar20 && image_histo->histograms[uVar36] != (VP8LHistogram *)0x0) {
          do {
            if (image_histo->histograms[uVar40] != (VP8LHistogram *)0x0) {
              HistoQueuePush(&local_198,(VP8LHistogram **)local_188._0_8_,(int)uVar36,(int)uVar40,
                             0.0);
            }
            uVar40 = uVar40 + 1;
          } while (uVar20 != uVar40);
        }
        uVar37 = uVar37 + 1;
        uVar36 = uVar1;
      } while (uVar1 != uVar20);
      do {
        iVar23 = local_198.size;
        do {
          pHVar33 = local_198.queue;
          if (iVar23 < 1) goto LAB_00142aad;
          uVar35 = (local_198.queue)->idx1;
          uVar38 = (local_198.queue)->idx2;
          uVar12 = local_188._0_8_;
          pVVar4 = *(VP8LHistogram **)(local_188._0_8_ + (long)(int)uVar38 * 8);
          pVVar5 = *(VP8LHistogram **)(local_188._0_8_ + (long)(int)uVar35 * 8);
          VP8LHistogramAdd(pVVar4,pVVar5,pVVar5);
          uVar15 = pVVar4->trivial_symbol_;
          if (uVar15 != pVVar5->trivial_symbol_) {
            uVar15 = 0xffffffff;
          }
          pVVar5->trivial_symbol_ = uVar15;
          *(double *)(*(long *)(uVar12 + (long)(int)uVar35 * 8) + 0xcb0) = pHVar33->cost_combo;
          image_histo->histograms[(int)uVar38] = (VP8LHistogram *)0x0;
          uVar16 = image_histo->size;
          if (0 < (int)uVar16 && uVar16 - 1 == uVar38) {
            do {
              if (image_histo->histograms[(ulong)uVar16 - 1] != (VP8LHistogram *)0x0) break;
              image_histo->size = uVar16 - 1;
              bVar6 = 1 < (int)uVar16;
              uVar16 = uVar16 - 1;
            } while (bVar6);
          }
          iVar32 = 0;
          do {
            pHVar27 = pHVar33 + iVar32;
            if ((((pHVar27->idx1 == uVar35) || (pHVar27->idx2 == uVar38)) ||
                (pHVar27->idx1 == uVar38)) || (pHVar27->idx2 == uVar35)) {
              pHVar27->cost_combo = pHVar33[(long)iVar23 + -1].cost_combo;
              pHVar2 = pHVar33 + (long)iVar23 + -1;
              iVar14 = pHVar2->idx2;
              dVar80 = pHVar2->cost_diff;
              pHVar27->idx1 = pHVar2->idx1;
              pHVar27->idx2 = iVar14;
              pHVar27->cost_diff = dVar80;
              iVar23 = iVar23 + -1;
            }
            else {
              if (pHVar27->cost_diff <= pHVar33->cost_diff &&
                  pHVar33->cost_diff != pHVar27->cost_diff) {
                local_138[0].last_pos_ = (PixOrCopy *)pHVar33->cost_combo;
                local_138[0].cur_pos = *(PixOrCopy **)pHVar33;
                local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar33->cost_diff;
                pHVar33->cost_combo = pHVar27->cost_combo;
                iVar14 = pHVar27->idx2;
                dVar80 = pHVar27->cost_diff;
                pHVar33->idx1 = pHVar27->idx1;
                pHVar33->idx2 = iVar14;
                pHVar33->cost_diff = dVar80;
                pHVar27->cost_combo = (double)local_138[0].last_pos_;
                *(PixOrCopy **)pHVar27 = local_138[0].cur_pos;
                pHVar27->cost_diff = (double)local_138[0].cur_block_;
              }
              iVar32 = iVar32 + 1;
            }
          } while (iVar32 < iVar23);
          local_198.size = iVar23;
          iVar32 = image_histo->size;
        } while (iVar32 < 1);
        uVar20 = 0;
        do {
          if ((uVar35 != uVar20) && (image_histo->histograms[uVar20] != (VP8LHistogram *)0x0)) {
            HistoQueuePush(&local_198,image_histo->histograms,uVar35,(int)uVar20,0.0);
            iVar32 = image_histo->size;
          }
          uVar20 = uVar20 + 1;
        } while ((long)uVar20 < (long)iVar32);
      } while( true );
    }
LAB_00142aad:
    WebPSafeFree(local_198.queue);
    pVVar39 = local_170;
  }
LAB_00142b2b:
  iVar23 = image_histo->size;
  if ((long)iVar23 < 1) {
    image_histo->size = 0;
    uVar20 = (ulong)(uint)image_histo->max_size;
    uVar35 = 0;
    if (image_histo->max_size < 1) goto LAB_00142d08;
    ppVVar31 = pVVar39->histograms;
    ppVVar34 = image_histo->histograms;
LAB_00142c80:
    memset(histogram_symbols,0,(ulong)(uint)((int)uVar20 * 2));
    VP8LHistogramSetClear(image_histo);
LAB_00142ca4:
    image_histo->size = uVar35;
    uVar36 = 0;
    do {
      pVVar4 = ppVVar31[uVar36];
      if (pVVar4 != (VP8LHistogram *)0x0) {
        pVVar5 = ppVVar34[histogram_symbols[uVar36]];
        VP8LHistogramAdd(pVVar4,pVVar5,pVVar5);
        uVar15 = pVVar4->trivial_symbol_;
        if (uVar15 != pVVar5->trivial_symbol_) {
          uVar15 = 0xffffffff;
        }
        pVVar5->trivial_symbol_ = uVar15;
      }
      uVar36 = uVar36 + 1;
      pVVar39 = local_170;
    } while (uVar20 != uVar36);
  }
  else {
    lVar19 = 0;
    uVar35 = 0;
    do {
      pVVar4 = image_histo->histograms[lVar19];
      if (pVVar4 != (VP8LHistogram *)0x0) {
        uVar20 = (ulong)uVar35;
        uVar35 = uVar35 + 1;
        image_histo->histograms[uVar20] = pVVar4;
      }
      lVar19 = lVar19 + 1;
    } while (iVar23 != lVar19);
    image_histo->size = uVar35;
    ppVVar31 = pVVar39->histograms;
    ppVVar34 = image_histo->histograms;
    uVar38 = image_histo->max_size;
    uVar20 = (ulong)uVar38;
    if ((int)uVar35 < 2) {
      if (0 < (int)uVar38) goto LAB_00142c80;
    }
    else if (0 < (int)uVar38) {
      uVar36 = 0;
      do {
        if (ppVVar31[uVar36] == (VP8LHistogram *)0x0) {
          histogram_symbols[uVar36] = histogram_symbols[uVar36 - 1];
        }
        else {
          uVar37 = 0;
          pPVar42 = (PixOrCopy *)0x47d2ced32a16a1b1;
          uVar56 = 0;
          do {
            local_188._0_8_ = pPVar42;
            local_138[0].cur_pos =
                 (PixOrCopy *)((ulong)ppVVar34[uVar37]->bit_cost_ ^ 0x8000000000000000);
            GetCombinedHistogramEntropy
                      (ppVVar34[uVar37],ppVVar31[uVar36],(double)pPVar42,(double *)local_138);
            pPVar42 = local_138[0].cur_pos;
            if ((double)local_188._0_8_ <= (double)local_138[0].cur_pos && uVar37 != 0) {
              pPVar42 = (PixOrCopy *)local_188._0_8_;
            }
            uVar57 = (int)uVar37;
            if ((double)local_188._0_8_ <= (double)local_138[0].cur_pos && uVar37 != 0) {
              uVar57 = uVar56;
            }
            uVar37 = uVar37 + 1;
            uVar56 = uVar57;
          } while (uVar35 != uVar37);
          histogram_symbols[uVar36] = (uint16_t)uVar57;
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar20);
      VP8LHistogramSetClear(image_histo);
      goto LAB_00142ca4;
    }
LAB_00142d08:
    VP8LHistogramSetClear(image_histo);
    image_histo->size = uVar35;
  }
  iVar23 = 1;
LAB_00142d20:
  WebPSafeFree(pVVar39);
  WebPSafeFree(__s);
  return iVar23;
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs,
                             int quality, int low_effort,
                             int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint16_t* const histogram_symbols) {
  int ok = 0;
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      WebPSafeMalloc(2 * image_histo_raw_size, sizeof(map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) goto Error;

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const double combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, &num_used, histogram_symbols,
                               cluster_mappings, tmp_histo, bin_map,
                               entropy_combine_num_bins, combine_cost_factor,
                               low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    const float x = quality / 100.f;
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size = (int)(1 + (x * x * x) * (MAX_HISTO_GREEDY - 1));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  ok = 1;

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return ok;
}